

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servls.cpp
# Opt level: O2

int __thiscall
icu_63::ServiceEnumeration::clone
          (ServiceEnumeration *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  uint in_EAX;
  ServiceEnumeration *this_00;
  UErrorCode status;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  this_00 = (ServiceEnumeration *)UMemory::operator_new((UMemory *)0xb8,(size_t)__fn);
  if (this_00 != (ServiceEnumeration *)0x0) {
    ServiceEnumeration(this_00,this,(UErrorCode *)((long)&uStack_18 + 4));
    if (uStack_18._4_4_ < 1) goto LAB_002a2668;
    (*(this_00->super_StringEnumeration).super_UObject._vptr_UObject[1])(this_00);
  }
  this_00 = (ServiceEnumeration *)0x0;
LAB_002a2668:
  return (int)this_00;
}

Assistant:

virtual StringEnumeration *clone() const {
        UErrorCode status = U_ZERO_ERROR;
        ServiceEnumeration *cl = new ServiceEnumeration(*this, status);
        if(U_FAILURE(status)) {
            delete cl;
            cl = NULL;
        }
        return cl;
    }